

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O2

DisasJumpType op_vs(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  DisasJumpType DVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar1 = get_field1(s,FLD_O_m4,FLD_C_b4);
  uVar1 = uVar1 & 0xff;
  if (uVar1 < 5) {
    DVar5 = DISAS_NEXT;
    iVar2 = get_field1(s,FLD_O_v1,FLD_C_b1);
    if (uVar1 == 4) {
      iVar3 = get_field1(s,FLD_O_v2,FLD_C_d4);
      iVar4 = get_field1(s,FLD_O_v3,FLD_C_i3);
      gen_gvec128_3_i64(tcg_ctx,tcg_gen_sub2_i64_s390x,(uint8_t)iVar2,(uint8_t)iVar3,(uint8_t)iVar4)
      ;
      DVar5 = DISAS_NEXT;
    }
    else {
      dofs = vec_full_reg_offset((uint8_t)iVar2);
      iVar2 = get_field1(s,FLD_O_v2,FLD_C_d4);
      aofs = vec_full_reg_offset((uint8_t)iVar2);
      iVar2 = get_field1(s,FLD_O_v3,FLD_C_i3);
      bofs = vec_full_reg_offset((uint8_t)iVar2);
      tcg_gen_gvec_sub_s390x(tcg_ctx,uVar1,dofs,aofs,bofs,0x10,0x10);
    }
  }
  else {
    gen_program_exception(s,6);
    DVar5 = DISAS_NORETURN;
  }
  return DVar5;
}

Assistant:

static DisasJumpType op_vs(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t es = get_field(s, m4);

    if (es > ES_128) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    } else if (es == ES_128) {
        gen_gvec128_3_i64(tcg_ctx, tcg_gen_sub2_i64, get_field(s, v1),
                          get_field(s, v2), get_field(s, v3));
        return DISAS_NEXT;
    }
    gen_gvec_fn_3(tcg_ctx, sub, es, get_field(s, v1), get_field(s, v2),
                  get_field(s, v3));
    return DISAS_NEXT;
}